

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ForcePlatforms.cpp
# Opt level: O1

void __thiscall
ezc3d::Modules::ForcePlatform::extractCalMatrix(ForcePlatform *this,size_t idx,c3d *c3d)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  double dVar2;
  unsigned_long uVar3;
  vector<double,_std::allocator<double>_> *pvVar4;
  bool bVar5;
  Parameters *this_00;
  Group *this_01;
  Parameter *this_02;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *pvVar6;
  double *pdVar7;
  runtime_error *this_03;
  size_t j;
  size_t col;
  ulong uVar8;
  size_t sVar9;
  long lVar10;
  string local_68;
  vector<double,_std::allocator<double>_> *local_48;
  long local_40;
  Matrix *local_38;
  
  this_00 = ezc3d::c3d::parameters(c3d);
  paVar1 = &local_68.field_2;
  local_68._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"FORCE_PLATFORM","");
  this_01 = ParametersNS::Parameters::group(this_00,&local_68);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar1) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  sVar9 = this->_type;
  local_68._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"CAL_MATRIX","");
  bVar5 = ParametersNS::GroupNS::Group::isParameter(this_01,&local_68);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != paVar1) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  if (bVar5) {
    local_68._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_68,"CAL_MATRIX","");
    this_02 = ParametersNS::GroupNS::Group::parameter(this_01,&local_68);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != paVar1) {
      operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
    }
    pvVar6 = ParametersNS::GroupNS::Parameter::dimension(this_02);
    if (((ulong)((long)(pvVar6->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                       _M_impl.super__Vector_impl_data._M_finish -
                (long)(pvVar6->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                      _M_impl.super__Vector_impl_data._M_start) < 0x11) ||
       (pvVar6 = ParametersNS::GroupNS::Parameter::dimension(this_02),
       (pvVar6->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
       super__Vector_impl_data._M_start[2] <= idx)) {
      if (2 < this->_type - 1) {
        this_03 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error
                  (this_03,
                   "FORCE_PLATFORM:CAL_MATRIX is not fill properly to extract Force platform informations"
                  );
        goto LAB_00139d4f;
      }
    }
    else {
      local_48 = ParametersNS::GroupNS::Parameter::valuesAsDouble(this_02);
      if ((local_48->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
          super__Vector_impl_data._M_finish ==
          (local_48->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
          super__Vector_impl_data._M_start) {
        Matrix::setIdentity(&(this->_calMatrix).super_Matrix);
      }
      else {
        uVar8 = (ulong)(sVar9 - 1 < 4) - 1 | 6;
        pvVar6 = ParametersNS::GroupNS::Parameter::dimension(this_02);
        uVar3 = *(pvVar6->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl
                 .super__Vector_impl_data._M_start;
        pvVar6 = ParametersNS::GroupNS::Parameter::dimension(this_02);
        pvVar4 = local_48;
        local_38 = &(this->_calMatrix).super_Matrix;
        lVar10 = uVar3 * (pvVar6->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)
                         ._M_impl.super__Vector_impl_data._M_start[1] * idx * 8;
        sVar9 = 0;
        do {
          col = 0;
          local_40 = lVar10;
          do {
            dVar2 = *(double *)
                     ((long)(pvVar4->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                            super__Vector_impl_data._M_start + lVar10);
            pdVar7 = Matrix::operator()(local_38,sVar9,col);
            *pdVar7 = dVar2;
            col = col + 1;
            lVar10 = lVar10 + uVar8 * 8;
          } while (uVar8 != col);
          sVar9 = sVar9 + 1;
          lVar10 = local_40 + 8;
        } while (sVar9 != uVar8);
      }
    }
  }
  else if (this->_type != 2) {
    this_03 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error
              (this_03,
               "FORCE_PLATFORM:CAL_MATRIX was not found, but is required for the type of force platform"
              );
LAB_00139d4f:
    __cxa_throw(this_03,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  return;
}

Assistant:

void ezc3d::Modules::ForcePlatform::extractCalMatrix(size_t idx,
                                                     const ezc3d::c3d &c3d) {
  const ezc3d::ParametersNS::GroupNS::Group &groupPF(
      c3d.parameters().group("FORCE_PLATFORM"));

  size_t nChannels(-1);
  if (_type >= 1 && _type <= 4) {
    nChannels = 6;
  }

  if (!groupPF.isParameter("CAL_MATRIX")) {
    if (_type == 2) {
      // CAL_MATRIX is ignore for type 2
      // If none is found, returns all zeros
      return;
    } else {
      throw std::runtime_error(
          "FORCE_PLATFORM:CAL_MATRIX was not found, but is "
          "required for the type of force platform");
    }
  }

  // Check dimensions
  const auto &calMatrixParam(groupPF.parameter("CAL_MATRIX"));
  if (calMatrixParam.dimension().size() < 3 ||
      calMatrixParam.dimension()[2] <= idx) {
    if (_type == 1 || _type == 2 || _type == 3) {
      // CAL_MATRIX is ignore for type 2
      // If none is found, returns all zeros
      return;
    } else {
      throw std::runtime_error("FORCE_PLATFORM:CAL_MATRIX is not fill properly "
                               "to extract Force platform informations");
    }
  }

  const std::vector<double> &val(calMatrixParam.valuesAsDouble());
  if (val.size() == 0) {
    // This is for Motion Analysis not providing a calibration matrix
    _calMatrix.setIdentity();
  } else {
    size_t skip(calMatrixParam.dimension()[0] * calMatrixParam.dimension()[1]);
    for (size_t i = 0; i < nChannels; ++i) {
      for (size_t j = 0; j < nChannels; ++j) {
        _calMatrix(i, j) = val[skip * idx + j * nChannels + i];
      }
    }
  }
}